

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notification.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::Notification::WaitForNotificationWithTimeout
          (Notification *this,Duration timeout)

{
  Duration timeout_00;
  ObjectKind OVar1;
  Notification *local_88;
  Condition local_58;
  byte local_31;
  Notification *pNStack_30;
  bool notified;
  Notification *this_local;
  uint32_t local_1c;
  HiRep local_14;
  Duration timeout_local;
  
  local_1c = timeout.rep_lo_;
  register0x00000030 = timeout.rep_hi_;
  pNStack_30 = this;
  local_14 = register0x00000030;
  timeout_local.rep_hi_.lo_ = local_1c;
  OVar1 = TraceObjectKind();
  base_internal::TraceWait(this,OVar1);
  local_31 = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!(bool)local_31) {
    Condition::Condition<std::atomic<bool>const>
              (&local_58,HasBeenNotifiedInternal,&this->notified_yet_);
    timeout_00.rep_lo_ = timeout_local.rep_hi_.lo_;
    timeout_00.rep_hi_ = local_14;
    local_31 = Mutex::LockWhenWithTimeout(&this->mutex_,&local_58,timeout_00);
    Mutex::Unlock(&this->mutex_);
  }
  local_88 = this;
  if ((local_31 & 1) == 0) {
    local_88 = (Notification *)0x0;
  }
  OVar1 = TraceObjectKind();
  base_internal::TraceContinue(local_88,OVar1);
  return (bool)(local_31 & 1);
}

Assistant:

bool Notification::WaitForNotificationWithTimeout(
    absl::Duration timeout) const {
  base_internal::TraceWait(this, TraceObjectKind());
  bool notified = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!notified) {
    notified = this->mutex_.LockWhenWithTimeout(
        Condition(&HasBeenNotifiedInternal, &this->notified_yet_), timeout);
    this->mutex_.Unlock();
  }
  base_internal::TraceContinue(notified ? this : nullptr, TraceObjectKind());
  return notified;
}